

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O1

void __thiscall cmServerBase::Close(cmServerBase *this)

{
  uv_loop_t *loop;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  int in_R8D;
  
  loop = &this->Loop;
  if ((this->Loop).data != (void *)0x0) {
    if (((this->ServeThreadRunning)._M_base._M_i & 1U) != 0) {
      auto_async_t::send(&this->ShutdownSignal,in_ESI,in_RDX,in_RCX,in_R8D);
      uv_thread_join(&this->ServeThread);
    }
    uv_loop_close(loop);
    loop->data = (void *)0x0;
  }
  uv_loop_close(loop);
  return;
}

Assistant:

void cmServerBase::Close()
{
  if (Loop.data) {
    if (ServeThreadRunning) {
      this->ShutdownSignal.send();
      uv_thread_join(&ServeThread);
    }

    uv_loop_close(&Loop);
    Loop.data = CM_NULLPTR;
  }

  uv_loop_close(&Loop);
}